

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

void Aig_ManFlipFirstPo(Aig_Man_t *p)

{
  void *pvVar1;
  
  pvVar1 = Vec_PtrEntry(p->vCos,0);
  if (((ulong)pvVar1 & 1) == 0) {
    *(byte *)((long)pvVar1 + 8) = *(byte *)((long)pvVar1 + 8) ^ 1;
    return;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                ,0x13c,"void Aig_ObjChild0Flip(Aig_Obj_t *)");
}

Assistant:

void Aig_ManFlipFirstPo( Aig_Man_t * p )
{
    Aig_ObjChild0Flip( Aig_ManCo(p, 0) ); 
}